

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

size_t nallocx_slow(size_t size,int flags)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  Length LVar5;
  ulong uVar6;
  
  if (tcmalloc::Static::inited_ == '\0') {
    tcmalloc::ThreadCache::InitModule();
  }
  uVar6 = 1L << (sbyte)(flags & 0x3fU);
  if (0xd < (flags & 0x3fU)) {
    uVar6 = 0;
    bVar1 = false;
    goto LAB_00112770;
  }
  uVar3 = -uVar6 & (size + uVar6) - 1;
  if ((uVar3 == 0) && (uVar3 = uVar6, size != 0)) {
    uVar3 = size;
  }
  if (uVar3 < 0x401) {
    uVar2 = (int)uVar3 + 7U >> 3;
LAB_00112759:
    uVar3 = (ulong)uVar2;
    bVar1 = true;
  }
  else {
    if (uVar3 < 0x40001) {
      uVar2 = (int)uVar3 + 0x3c7fU >> 7;
      goto LAB_00112759;
    }
    bVar1 = false;
  }
  if (bVar1) {
    uVar6 = (ulong)(byte)(&tcmalloc::Static::sizemap_)[uVar3 & 0xffffffff];
  }
  else {
    uVar6 = 0;
  }
LAB_00112770:
  if (bVar1) {
    sVar4 = (size_t)(int)(&DAT_0012e844)[uVar6];
  }
  else {
    LVar5 = tcmalloc::PageHeap::RoundUpSize
                      ((PageHeap *)tcmalloc::Static::pageheap_,
                       ((size >> 0xd) + 1) - (ulong)((size & 0x1fff) == 0));
    sVar4 = LVar5 << 0xd;
  }
  return sVar4;
}

Assistant:

static ATTRIBUTE_NOINLINE size_t nallocx_slow(size_t size, int flags) {
  if (PREDICT_FALSE(!Static::IsInited())) ThreadCache::InitModule();

  size_t align = static_cast<size_t>(1ull << (flags & 0x3f));
  uint32_t cl;
  bool ok = size_class_with_alignment(size, align, &cl);
  if (ok) {
    return Static::sizemap()->ByteSizeForClass(cl);
  } else {
    Length pages = tcmalloc::pages(size);
    pages = Static::pageheap()->RoundUpSize(pages);
    return pages << kPageShift;
  }
}